

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int p_col;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  pointer pnVar13;
  long lVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  long lVar20;
  uint *puVar21;
  int iVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  int iVar24;
  int *piVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  byte bVar29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar29 = 0;
  piVar5 = (this->row).orig;
  piVar6 = (this->row).perm;
  piVar7 = (this->temp).s_mark;
  lVar20 = 0;
  do {
    if ((this->temp).stage <= lVar20) {
      return;
    }
    iVar1 = piVar5[lVar20];
    piVar8 = (this->u).row.idx;
    iVar2 = (this->u).row.start[iVar1];
    uVar3 = (this->u).row.len[iVar1];
    if ((int)uVar3 < 1) {
      uVar3 = 0;
    }
    piVar18 = piVar8;
    for (uVar27 = 0; uVar27 != uVar3; uVar27 = uVar27 + 1) {
      p_col = piVar8[(long)iVar2 + uVar27];
      piVar9 = (this->u).col.idx;
      piVar10 = (this->u).col.start;
      piVar11 = (this->u).col.len;
      piVar12 = (this->temp).s_cact;
      iVar24 = (piVar11[p_col] + piVar10[p_col]) - piVar12[p_col];
      piVar15 = piVar9 + iVar24;
      do {
        piVar25 = piVar15;
        piVar15 = piVar25 + 1;
      } while (*piVar25 != iVar1);
      *piVar25 = piVar9[iVar24];
      piVar9[iVar24] = iVar1;
      iVar24 = piVar12[p_col];
      piVar12[p_col] = iVar24 + -1;
      if (iVar24 == 2) {
        iVar24 = piVar11[p_col];
        piVar11[p_col] = iVar24 + -1;
        iVar24 = piVar9[(long)piVar10[p_col] + (long)iVar24 + -1];
        if (-1 < piVar6[iVar24]) goto LAB_003ed5e9;
        piVar9 = (this->u).row.len;
        iVar22 = piVar9[iVar24] + -1;
        iVar4 = (this->u).row.start[iVar24];
        piVar9[iVar24] = iVar22;
        lVar19 = (long)(iVar4 + iVar22);
        lVar17 = lVar19 * 4 + 4;
        lVar16 = lVar19 * 0x80 + 0x80;
        do {
          lVar28 = lVar16;
          lVar26 = lVar17 + -4;
          lVar14 = lVar17 + -4;
          lVar17 = lVar26;
          lVar16 = lVar28 + -0x80;
        } while (*(int *)((long)piVar18 + lVar14) != p_col);
        iVar4 = (this->temp).stage;
        pnVar13 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar21 = (uint *)((long)pnVar13[-1].m_backend.data._M_elems + lVar28);
        pnVar23 = &local_b0;
        for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar29 * -2 + 1) * 4);
        }
        local_b0.m_backend.exp = *(int *)((long)(&pnVar13[-1].m_backend.data + 1) + lVar28);
        local_b0.m_backend.neg = *(bool *)((long)(&pnVar13[-1].m_backend.data + 1) + 4U + lVar28);
        local_b0.m_backend._120_8_ =
             *(undefined8 *)((long)(&pnVar13[-1].m_backend.data + 1) + 8U + lVar28);
        setPivot(this,iVar4,p_col,iVar24,&local_b0);
        iVar24 = (this->temp).stage;
        (this->temp).stage = iVar24 + 1;
        piVar7[iVar24] = p_col;
        pnVar13 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)pnVar13[-1].m_backend.data._M_elems + lVar28),&pnVar13[lVar19].m_backend);
        piVar18 = (this->u).row.idx;
        *(int *)((long)piVar18 + lVar26) = piVar18[lVar19];
      }
      else if (iVar24 == 1) {
LAB_003ed5e9:
        this->stat = SINGULAR;
        return;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}